

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdblobimpl.h
# Opt level: O0

bool __thiscall SQBlob::GrowBufOf(SQBlob *this,SQInteger n)

{
  long lVar1;
  long lVar2;
  bool local_19;
  bool ret;
  SQInteger n_local;
  SQBlob *this_local;
  
  local_19 = true;
  if (this->_allocated < this->_size + n) {
    lVar1 = this->_size + n;
    lVar2 = this->_size * 2;
    if (lVar1 == lVar2 || SBORROW8(lVar1,lVar2) != lVar1 + this->_size * -2 < 0) {
      local_19 = Resize(this,this->_size << 1);
    }
    else {
      local_19 = Resize(this,this->_size + n);
    }
  }
  this->_size = this->_size + n;
  return local_19;
}

Assistant:

bool GrowBufOf(SQInteger n)
    {
        bool ret = true;
        if(_size + n > _allocated) {
            if(_size + n > _size * 2)
                ret = Resize(_size + n);
            else
                ret = Resize(_size * 2);
        }
        _size = _size + n;
        return ret;
    }